

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,int *i,int *last,uint *targetBucket)

{
  int iVar1;
  long lVar2;
  long lVar3;
  PropertyRecord *pPVar4;
  uint uVar5;
  int *piVar6;
  
  lVar2 = *(long *)this;
  if (lVar2 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                         *)this,(*key)->hash * 2 + 1);
    *targetBucket = uVar5;
    *last = -1;
    lVar3 = *(long *)(this + 8);
    piVar6 = (int *)(lVar2 + (ulong)*targetBucket * 4);
    pPVar4 = *key;
    uVar5 = 0;
    while( true ) {
      iVar1 = *piVar6;
      *i = iVar1;
      if ((long)iVar1 < 0) break;
      if (*(PropertyRecord **)(lVar3 + 0x10 + (long)iVar1 * 0x18) == pPVar4) {
        if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
          return true;
        }
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
        return true;
      }
      uVar5 = uVar5 + 1;
      *last = iVar1;
      piVar6 = (int *)((long)*i * 0x18 + lVar3 + 8);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }